

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_edge_iterator.cc
# Opt level: O2

string * __thiscall
s2shapeutil::EdgeIterator::DebugString_abi_cxx11_(string *__return_storage_ptr__,EdgeIterator *this)

{
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  absl::string_view::string_view(&local_60.piece_,"(shape=");
  absl::AlphaNum::AlphaNum(&local_90,this->shape_id_);
  absl::string_view::string_view(&local_c0.piece_,", edge=");
  absl::AlphaNum::AlphaNum(&local_f0,this->edge_id_);
  absl::string_view::string_view(&local_120.piece_,")");
  absl::StrCat<>(__return_storage_ptr__,&local_60,&local_90,&local_c0,&local_f0,&local_120);
  return __return_storage_ptr__;
}

Assistant:

string EdgeIterator::DebugString() const {
  return absl::StrCat("(shape=", shape_id_, ", edge=", edge_id_, ")");
}